

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-app.h
# Opt level: O2

bool __thiscall
mp::SolverApp<TestSolver,_TestNLReader>::Init
          (SolverApp<TestSolver,_TestNLReader> *this,char **argv,int nl_reader_flags)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *__s;
  char **argv_local;
  pointer local_258;
  MemoryWriter banner;
  
  argv_local = argv;
  pcVar3 = internal::SolverAppOptionParser::Parse(&this->option_parser_,&argv_local);
  if (pcVar3 != (char *)0x0) {
    if (((this->solver_).super_Solver.super_BasicSolver.bool_options_ & 2) != 0) {
      banner.super_BasicWriter<char>.buffer_ = &banner.buffer_.super_Buffer<char>;
      banner.super_BasicWriter<char>._vptr_BasicWriter =
           (_func_int **)&PTR__BasicMemoryWriter_0025b1f8;
      banner.buffer_.super_Buffer<char>.ptr_ = banner.buffer_.data_;
      banner.buffer_.super_Buffer<char>.size_ = 0;
      banner.buffer_.super_Buffer<char>.capacity_ = 500;
      banner.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_0025b240;
      local_258 = (this->solver_).super_Solver.super_BasicSolver.long_name_._M_dataplus._M_p;
      fmt::BasicWriter<char>::write<char_const*>
                (&banner.super_BasicWriter<char>,(BasicCStringRef<char>)0x1ed839,&local_258);
      __s = fmt::BasicWriter<char>::c_str(&banner.super_BasicWriter<char>);
      fputs(__s,_stdout);
      fflush(_stdout);
      this->banner_size = (uint)(banner.super_BasicWriter<char>.buffer_)->size_;
      (this->output_handler_).has_output = false;
      fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&banner);
    }
    std::__cxx11::string::assign((char *)&this->nl_filename);
    std::__cxx11::string::_M_assign((string *)&this->filename_no_ext);
    pcVar3 = strrchr(pcVar3,0x2e);
    if ((pcVar3 == (char *)0x0) || (iVar2 = strcmp(pcVar3,".nl"), iVar2 != 0)) {
      std::__cxx11::string::append((char *)&this->nl_filename);
    }
    else {
      std::__cxx11::string::resize((ulong)&this->filename_no_ext);
    }
    bVar1 = TestSolver::ParseOptions
                      (&this->solver_,argv_local,(this->option_parser_).echo_solver_options_ ^ 1,
                       (ASLProblem *)0x0);
    if (bVar1) {
      return true;
    }
    this->result_code_ = 1;
  }
  return false;
}

Assistant:

bool SolverApp<Solver, Reader>::Init(char **argv, int nl_reader_flags) {
  internal::Unused(nl_reader_flags);

  // Parse command-line arguments.
  const char *filename = option_parser_.Parse(argv);
  if (!filename) return false;

  if (solver_.ampl_flag()) {
    fmt::MemoryWriter banner;
    banner.write("{}: ", solver_.long_name());
    std::fputs(banner.c_str(), stdout);
    std::fflush(stdout);
    banner_size = static_cast<unsigned>(banner.size());
    output_handler_.has_output = false;
  }

  // Add .nl extension if necessary.
  nl_filename = filename;
  filename_no_ext = nl_filename;
  const char *ext = std::strrchr(filename, '.');
  if (!ext || std::strcmp(ext, ".nl") != 0)
    nl_filename += ".nl";
  else
    filename_no_ext.resize(filename_no_ext.size() - 3);
  internal::SetBasename(solver_, &filename_no_ext);

  // Parse solver options.
  unsigned flags =
      option_parser_.echo_solver_options() ? 0 : Solver::NO_OPTION_ECHO;
  if (!solver_.ParseOptions(argv, flags)) {
    result_code_ = 1;
    return false;
  }

  return true;
}